

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.c
# Opt level: O1

void MatchFinder_Init_2(CMatchFinder *p,int readData)

{
  uint uVar1;
  UInt32 lenLimit;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  if ((ulong)p->hashSizeSum != 0) {
    memset(p->hash,0,(ulong)p->hashSizeSum << 2);
  }
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->streamPos = p->cyclicBufferSize;
  p->pos = p->cyclicBufferSize;
  p->result = 0;
  p->streamEndWasReached = '\0';
  if (readData != 0) {
    MatchFinder_ReadBlock(p);
  }
  uVar1 = p->pos;
  uVar4 = p->cyclicBufferSize - p->cyclicBufferPos;
  if (~uVar1 <= uVar4) {
    uVar4 = ~uVar1;
  }
  uVar2 = p->streamPos - uVar1;
  uVar5 = uVar2 - p->keepSizeAfter;
  uVar3 = (uint)(uVar2 != 0);
  if (p->keepSizeAfter <= uVar2 && uVar5 != 0) {
    uVar3 = uVar5;
  }
  if (uVar4 <= uVar3) {
    uVar3 = uVar4;
  }
  if (p->matchMaxLen <= uVar2) {
    uVar2 = p->matchMaxLen;
  }
  p->lenLimit = uVar2;
  p->posLimit = uVar3 + uVar1;
  return;
}

Assistant:

void MatchFinder_Init_2(CMatchFinder *p, int readData)
{
  UInt32 i;
  UInt32 *hash = p->hash;
  UInt32 num = p->hashSizeSum;
  for (i = 0; i < num; i++)
    hash[i] = kEmptyHashValue;
  
  p->cyclicBufferPos = 0;
  p->buffer = p->bufferBase;
  p->pos = p->streamPos = p->cyclicBufferSize;
  p->result = SZ_OK;
  p->streamEndWasReached = 0;
  
  if (readData)
    MatchFinder_ReadBlock(p);
  
  MatchFinder_SetLimits(p);
}